

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

string * tinyusdz::tydra::DumpRenderScene
                   (string *__return_storage_ptr__,RenderScene *scene,string *format)

{
  char *pcVar1;
  byte bVar2;
  _Rb_tree_color _Var3;
  pointer pSVar4;
  pointer pRVar5;
  pointer pRVar6;
  pointer pTVar7;
  pointer pBVar8;
  bool bVar9;
  uint uVar10;
  set<tinyusdz::tydra::UVTexture::Channel,_std::less<tinyusdz::tydra::UVTexture::Channel>,_std::allocator<tinyusdz::tydra::UVTexture::Channel>_>
  *psVar11;
  string *psVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long *plVar16;
  ostream *poVar17;
  pointer pAVar18;
  ostream *poVar19;
  undefined8 *puVar20;
  _Base_ptr p_Var21;
  ostream *poVar22;
  uint32_t uVar23;
  long *plVar24;
  ulong uVar25;
  uint32_t n;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t extraout_EDX_21;
  uint32_t extraout_EDX_22;
  uint32_t extraout_EDX_23;
  uint32_t extraout_EDX_24;
  uint32_t extraout_EDX_25;
  uint32_t extraout_EDX_26;
  uint32_t extraout_EDX_27;
  uint32_t extraout_EDX_28;
  uint32_t extraout_EDX_29;
  uint32_t extraout_EDX_30;
  uint32_t extraout_EDX_31;
  uint32_t extraout_EDX_32;
  uint32_t extraout_EDX_33;
  uint32_t extraout_EDX_34;
  uint32_t extraout_EDX_35;
  uint32_t extraout_EDX_36;
  uint32_t extraout_EDX_37;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t extraout_EDX_38;
  uint32_t extraout_EDX_39;
  uint32_t extraout_EDX_40;
  uint32_t extraout_EDX_41;
  uint32_t extraout_EDX_42;
  uint32_t extraout_EDX_43;
  uint32_t extraout_EDX_44;
  uint32_t extraout_EDX_45;
  uint32_t extraout_EDX_46;
  uint32_t extraout_EDX_47;
  uint32_t extraout_EDX_48;
  uint32_t extraout_EDX_49;
  uint32_t extraout_EDX_50;
  uint32_t extraout_EDX_51;
  uint32_t n_06;
  uint32_t extraout_EDX_52;
  uint32_t extraout_EDX_53;
  uint32_t extraout_EDX_54;
  uint32_t n_07;
  uint32_t n_08;
  uint32_t n_09;
  uint32_t n_10;
  uint32_t n_11;
  uint32_t n_12;
  uint32_t n_13;
  uint32_t n_14;
  uint32_t n_15;
  uint32_t n_16;
  uint32_t n_17;
  uint32_t n_18;
  uint32_t n_19;
  uint32_t extraout_EDX_55;
  uint32_t extraout_EDX_56;
  uint32_t extraout_EDX_57;
  uint32_t extraout_EDX_58;
  uint32_t n_20;
  uint32_t extraout_EDX_59;
  uint32_t extraout_EDX_60;
  uint32_t extraout_EDX_61;
  uint32_t extraout_EDX_62;
  WrapMode mode;
  uint32_t extraout_EDX_63;
  uint32_t extraout_EDX_64;
  uint32_t extraout_EDX_65;
  WrapMode mode_00;
  uint32_t extraout_EDX_66;
  uint32_t extraout_EDX_67;
  uint32_t extraout_EDX_68;
  uint32_t extraout_EDX_69;
  uint32_t extraout_EDX_70;
  uint32_t extraout_EDX_71;
  uint32_t extraout_EDX_72;
  uint32_t extraout_EDX_73;
  uint32_t extraout_EDX_74;
  uint32_t extraout_EDX_75;
  uint32_t extraout_EDX_76;
  uint32_t extraout_EDX_77;
  uint32_t extraout_EDX_78;
  uint32_t extraout_EDX_79;
  uint32_t extraout_EDX_80;
  uint32_t extraout_EDX_81;
  uint32_t extraout_EDX_82;
  uint32_t n_21;
  uint32_t n_22;
  uint32_t extraout_EDX_83;
  uint32_t extraout_EDX_84;
  uint32_t extraout_EDX_85;
  uint32_t extraout_EDX_86;
  uint32_t extraout_EDX_87;
  uint32_t extraout_EDX_88;
  uint32_t extraout_EDX_89;
  uint32_t extraout_EDX_90;
  uint32_t extraout_EDX_91;
  uint32_t extraout_EDX_92;
  uint32_t extraout_EDX_93;
  uint32_t extraout_EDX_94;
  uint32_t extraout_EDX_95;
  uint32_t extraout_EDX_96;
  ColorSpace cty;
  uint32_t extraout_EDX_97;
  uint32_t extraout_EDX_98;
  uint32_t extraout_EDX_99;
  uint32_t n_23;
  uint32_t n_24;
  uint32_t extraout_EDX_x00100;
  uint32_t extraout_EDX_x00101;
  ComponentType cty_00;
  uint32_t n_25;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t extraout_EDX_05;
  uint32_t extraout_EDX_06;
  uint32_t extraout_EDX_07;
  uint32_t extraout_EDX_08;
  uint32_t extraout_EDX_09;
  uint32_t extraout_EDX_10;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX_11;
  uint32_t extraout_EDX_12;
  uint32_t extraout_EDX_13;
  uint32_t extraout_EDX_14;
  uint32_t extraout_EDX_15;
  uint32_t extraout_EDX_16;
  uint32_t extraout_EDX_17;
  uint32_t extraout_EDX_18;
  uint32_t extraout_EDX_19;
  uint32_t extraout_EDX_20;
  RenderMesh *mesh;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar26;
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
  *samples;
  vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
  *samples_00;
  _Rb_tree_node_base *p_Var27;
  uint uVar28;
  pointer pUVar29;
  ulong uVar30;
  pointer pNVar31;
  ulong uVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  uint uVar34;
  RenderScene *pRVar35;
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  string __str_14;
  string __str_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream ss;
  string local_5b8;
  long *local_598;
  long local_590;
  long local_588;
  long lStack_580;
  string local_578;
  pointer local_558;
  char *local_550;
  long local_548;
  undefined2 local_540;
  undefined6 uStack_53e;
  RenderScene *local_530;
  ostream *local_528;
  _Rb_tree_node_base *local_520;
  undefined1 local_518 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508 [7];
  _Rb_tree_node_base a_Stack_498 [8];
  _Rb_tree_node_base *local_390;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378 [7];
  _Rb_tree_node_base local_308 [8];
  string *local_200;
  _Rb_tree_node_base *local_1f8;
  ostream *local_1f0;
  ulong local_1e8;
  _Base_ptr local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_200 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  iVar14 = ::std::__cxx11::string::compare((char *)format);
  if (iVar14 == 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"// `json` format is not supported yet. Use KDL format\n",0x36);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"title ",6);
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"\"","");
  local_388._0_8_ = (ostream *)(local_388 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_388,local_5b8._M_dataplus._M_p,
             local_5b8._M_dataplus._M_p + local_5b8._M_string_length);
  ::std::__cxx11::string::_M_append((char *)local_388,(ulong)(scene->usd_filename)._M_dataplus._M_p)
  ;
  plVar16 = (long *)::std::__cxx11::string::_M_append
                              ((char *)local_388,(ulong)local_5b8._M_dataplus._M_p);
  local_518._0_8_ = local_518 + 0x10;
  plVar24 = plVar16 + 2;
  if ((long *)*plVar16 == plVar24) {
    local_508[0]._0_8_ = *plVar24;
    local_508[0]._8_8_ = plVar16[3];
  }
  else {
    local_508[0]._0_8_ = *plVar24;
    local_518._0_8_ = (long *)*plVar16;
  }
  local_518._8_8_ = plVar16[1];
  *plVar16 = (long)plVar24;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
    operator_delete((void *)local_388._0_8_,
                    CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                             (undefined2)local_378[0]._M_allocated_capacity) + 1);
  }
  poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_518._0_8_,local_518._8_8_);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
    operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"default_root_node ",0x12);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Root Nodes : ",0x15);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Meshes : ",0x11);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Skeletons : ",0x14);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Animations : ",0x15);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Cameras : ",0x12);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Materials : ",0x14);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of UVTextures : ",0x15);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of TextureImages : ",0x18);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"// # of Buffers : ",0x12);
  poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"nodes {\n",8);
  pNVar31 = (scene->nodes).
            super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((scene->nodes).
      super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>._M_impl.
      super__Vector_impl_data._M_finish != pNVar31) {
    lVar36 = 0;
    uVar32 = 0;
    do {
      (anonymous_namespace)::DumpNode_abi_cxx11_
                ((string *)local_388,
                 (_anonymous_namespace_ *)
                 ((long)&(((Node *)(&pNVar31->local_matrix + -1))->prim_name)._M_dataplus._M_p +
                 lVar36),(Node *)0x1,(uint32_t)plVar24);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_388._0_8_,local_388._8_8_);
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      uVar32 = uVar32 + 1;
      pNVar31 = (scene->nodes).
                super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar36 = lVar36 + 0x1a8;
    } while (uVar32 < (ulong)(((long)(scene->nodes).
                                     super__Vector_base<tinyusdz::tydra::Node,_std::allocator<tinyusdz::tydra::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar31 >> 3
                              ) * 0x21cfb2b78c13521d));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"meshes {\n",9);
  local_530 = scene;
  if ((scene->meshes).
      super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (scene->meshes).
      super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar36 = 0;
    uVar32 = 0;
    do {
      pRVar35 = local_530;
      uVar23 = (uint32_t)plVar24;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      poVar17 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] ",2);
      (anonymous_namespace)::DumpMesh_abi_cxx11_
                ((string *)local_388,
                 (_anonymous_namespace_ *)
                 ((long)&(((pRVar35->meshes).
                           super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                           ._M_impl.super__Vector_impl_data._M_start)->prim_name)._M_dataplus._M_p +
                 lVar36),mesh,uVar23);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar17,(char *)local_388._0_8_,local_388._8_8_);
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      uVar32 = uVar32 + 1;
      plVar24 = (long *)0x8f9c18f9c18f9c19;
      lVar36 = lVar36 + 0x520;
    } while (uVar32 < (ulong)(((long)(local_530->meshes).
                                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->meshes).
                                     super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0x7063e7063e7063e7));
  }
  pRVar35 = local_530;
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"skeletons {\n",0xc);
  if ((pRVar35->skeletons).
      super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pRVar35->skeletons).
      super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar36 = 0;
    uVar32 = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_558 = (pointer)::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_558,"] ",2);
      pSVar4 = (pRVar35->skeletons).
               super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x1,n);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"skeleton {\n",0xb);
      pcVar1 = local_518 + 0x10;
      uVar23 = extraout_EDX;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_00;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"name ",5);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_518._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_518,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_518,*(ulong *)((long)&(pSVar4->prim_name)._M_dataplus._M_p + lVar36))
      ;
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_518,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_01;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_03;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_04;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"abs_path ",9);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_518._0_8_ = local_518 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_518,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_518,*(ulong *)((long)&(pSVar4->abs_path)._M_dataplus._M_p + lVar36));
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_518,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_05;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_06;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_07;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_08;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"anim_id ",8);
      poVar17 = (ostream *)
                ::std::ostream::operator<<(poVar17,*(int *)((long)&pSVar4->anim_id + lVar36));
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pcVar1 = local_518 + 0x10;
      uVar23 = extraout_EDX_09;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_10;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"display_name ",0xd);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_518._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_518,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_518,
                 *(ulong *)((long)(pSVar4->root_node).bind_transform.m +
                           lVar36 + 0xffffffffffffff98U));
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_518,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      anon_unknown_0::detail::DumpSkelNode
                ((stringstream *)local_388,
                 (SkelNode *)((long)(pSVar4->root_node).bind_transform.m + lVar36 + -0x48),2);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_388 + 0x10),"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x1,n_00);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"}\n",2);
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_558,local_550,local_548)
      ;
      if (local_550 != (char *)&local_540) {
        operator_delete(local_550,CONCAT62(uStack_53e,local_540) + 1);
      }
      uVar32 = uVar32 + 1;
      lVar36 = lVar36 + 0x1c8;
      pRVar35 = local_530;
    } while (uVar32 < (ulong)(((long)(local_530->skeletons).
                                     super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->skeletons).
                                     super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7dc11f7047dc11f7));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"animations {\n",0xd);
  if ((pRVar35->animations).
      super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pRVar35->animations).
      super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar17 = (ostream *)(local_388 + 0x10);
    local_520 = local_308;
    local_1f8 = a_Stack_498;
    uVar32 = 0;
    do {
      poVar22 = (ostream *)(local_388 + 0x10);
      paVar33 = &local_5b8.field_2;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_1f0 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1f0,"] ",2);
      pAVar18 = (pRVar35->animations).
                super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar32;
      local_1e8 = uVar32;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_518);
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x1,n_01);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"animation {\n",0xc);
      uVar23 = extraout_EDX_11;
      if ((ostream *)local_388._0_8_ != poVar22) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
        uVar23 = extraout_EDX_12;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"name ",5);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = poVar22;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_388,(ulong)(pAVar18->prim_name)._M_dataplus._M_p);
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((ostream *)local_388._0_8_ != poVar22) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar23 = extraout_EDX_13;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_14;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_15;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_16;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"abs_path ",9);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = poVar22;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_388,(ulong)(pAVar18->abs_path)._M_dataplus._M_p);
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((ostream *)local_388._0_8_ != poVar22) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar23 = extraout_EDX_17;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_18;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_19;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_20;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"display_name ",0xd);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = poVar22;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_388,(ulong)(pAVar18->display_name)._M_dataplus._M_p);
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((ostream *)local_388._0_8_ != poVar22) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar26 = extraout_RDX;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar26 = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar26 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar26 = extraout_RDX_02;
      }
      p_Var21 = *(_Base_ptr *)((long)&(pAVar18->channels_map)._M_t._M_impl + 0x18);
      auVar38._8_8_ = uVar26;
      auVar38._0_8_ = p_Var21;
      local_1e0 = (_Base_ptr)((long)&(pAVar18->channels_map)._M_t._M_impl + 8);
      if (p_Var21 != local_1e0) {
        do {
          p_Var27 = auVar38._0_8_;
          pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x2,auVar38._8_4_);
          poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_518 + 0x10),(char *)local_388._0_8_,local_388._8_8_
                              );
          poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar19,*(char **)(p_Var27 + 1),(long)p_Var27[1]._M_parent);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar19," {\n",3);
          uVar26 = extraout_RDX_03;
          if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_,
                            CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                     (undefined2)local_378[0]._M_allocated_capacity) + 1);
            uVar26 = extraout_RDX_04;
          }
          uVar23 = (uint32_t)uVar26;
          auVar37._8_8_ = uVar26;
          auVar37._0_8_ = p_Var27[2]._M_right;
          local_558 = (pointer)&p_Var27[2]._M_parent;
          local_390 = p_Var27;
          if ((pointer)p_Var27[2]._M_right != local_558) {
            do {
              p_Var27 = auVar37._0_8_;
              _Var3 = p_Var27[1]._M_color;
              uVar23 = auVar37._8_4_;
              if (_Var3 == 3) {
                pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,uVar23);
                poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                                     local_5b8._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"scales ",7);
                (anonymous_namespace)::detail::PrintAnimationSamples<std::array<float,3ul>>
                          (&local_578,(detail *)&p_Var27[8]._M_left,samples_00);
                local_550 = (char *)&local_540;
                local_540 = 0x22;
                local_548 = 1;
                local_378[0]._M_allocated_capacity._0_2_ = 0x22;
                local_388._8_8_ = 1;
                local_388._0_8_ = (ostream *)(local_388 + 0x10);
                ::std::__cxx11::string::_M_append
                          ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
                puVar20 = (undefined8 *)
                          ::std::__cxx11::string::_M_append((char *)local_388,(ulong)local_550);
                local_598 = &local_588;
                plVar16 = puVar20 + 2;
                if ((long *)*puVar20 == plVar16) {
                  local_588 = *plVar16;
                  lStack_580 = puVar20[3];
                }
                else {
                  local_588 = *plVar16;
                  local_598 = (long *)*puVar20;
                }
                local_590 = puVar20[1];
                *puVar20 = plVar16;
                puVar20[1] = 0;
                *(undefined1 *)(puVar20 + 2) = 0;
                if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
LAB_00352e50:
                  operator_delete((void *)local_388._0_8_,
                                  CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                           (undefined2)local_378[0]._M_allocated_capacity) + 1);
                }
LAB_00352e60:
                poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar19,(char *)local_598,local_590);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
                if (local_598 != &local_588) {
LAB_00352e95:
                  operator_delete(local_598,local_588 + 1);
                }
LAB_00352ea2:
                if (local_550 != (char *)&local_540) {
                  operator_delete(local_550,CONCAT62(uStack_53e,local_540) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_578._M_dataplus._M_p != &local_578.field_2) {
                  operator_delete(local_578._M_dataplus._M_p,
                                  CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                           local_578.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                  operator_delete(local_5b8._M_dataplus._M_p,
                                  local_5b8.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                if (_Var3 == 2) {
                  pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,uVar23);
                  local_528 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                                         local_5b8._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(local_528,"rotations ",10);
                  ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"[",1);
                  if (p_Var27[7]._M_parent != *(_Base_ptr *)(p_Var27 + 7)) {
                    lVar36 = 4;
                    uVar32 = 0;
                    do {
                      if (uVar32 != 0) {
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
                      }
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(",1);
                      poVar19 = ::std::ostream::_M_insert<double>
                                          ((double)*(float *)(*(long *)(p_Var27 + 7) + -4 + lVar36))
                      ;
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,", ",2);
                      poVar19 = ::std::operator<<(poVar19,(float4 *)
                                                          (*(long *)(p_Var27 + 7) + lVar36));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
                      uVar32 = uVar32 + 1;
                      lVar36 = lVar36 + 0x14;
                    } while (uVar32 < (ulong)(((long)p_Var27[7]._M_parent - *(long *)(p_Var27 + 7)
                                              >> 2) * -0x3333333333333333));
                  }
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"]",1);
                  ::std::__cxx11::stringbuf::str();
                  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
                  ::std::ios_base::~ios_base((ios_base *)local_520);
                  local_550 = (char *)&local_540;
                  local_540 = 0x22;
                  local_548 = 1;
                  local_378[0]._M_allocated_capacity._0_2_ = 0x22;
                  local_388._8_8_ = 1;
                  local_388._0_8_ = poVar17;
                  ::std::__cxx11::string::_M_append
                            ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
                  puVar20 = (undefined8 *)
                            ::std::__cxx11::string::_M_append((char *)local_388,(ulong)local_550);
                  plVar16 = puVar20 + 2;
                  if ((long *)*puVar20 == plVar16) {
                    local_588 = *plVar16;
                    lStack_580 = puVar20[3];
                    local_598 = &local_588;
                  }
                  else {
                    local_588 = *plVar16;
                    local_598 = (long *)*puVar20;
                  }
                  local_590 = puVar20[1];
                  *puVar20 = plVar16;
                  puVar20[1] = 0;
                  *(undefined1 *)(puVar20 + 2) = 0;
                  if ((ostream *)local_388._0_8_ != poVar17) {
                    operator_delete((void *)local_388._0_8_,
                                    CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                             (undefined2)local_378[0]._M_allocated_capacity) + 1);
                  }
                  poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      (local_528,(char *)local_598,local_590);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
                  if (local_598 != &local_588) goto LAB_00352e95;
                  goto LAB_00352ea2;
                }
                if (_Var3 == _S_black) {
                  pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,uVar23);
                  poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                                       local_5b8._M_string_length);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"translations ",0xd);
                  (anonymous_namespace)::detail::PrintAnimationSamples<std::array<float,3ul>>
                            (&local_578,(detail *)&p_Var27[5]._M_parent,samples);
                  local_550 = (char *)&local_540;
                  local_540 = 0x22;
                  local_548 = 1;
                  local_378[0]._M_allocated_capacity._0_2_ = 0x22;
                  local_388._8_8_ = 1;
                  local_388._0_8_ = poVar17;
                  ::std::__cxx11::string::_M_append
                            ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
                  plVar24 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)local_388,(ulong)local_550);
                  local_598 = &local_588;
                  plVar16 = plVar24 + 2;
                  if ((long *)*plVar24 == plVar16) {
                    local_588 = *plVar16;
                    lStack_580 = plVar24[3];
                  }
                  else {
                    local_588 = *plVar16;
                    local_598 = (long *)*plVar24;
                  }
                  local_590 = plVar24[1];
                  *plVar24 = (long)plVar16;
                  plVar24[1] = 0;
                  *(undefined1 *)(plVar24 + 2) = 0;
                  if ((ostream *)local_388._0_8_ != poVar17) goto LAB_00352e50;
                  goto LAB_00352e60;
                }
              }
              auVar37 = ::std::_Rb_tree_increment(p_Var27);
              uVar23 = auVar37._8_4_;
            } while (auVar37._0_8_ != local_558);
          }
          pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x2,uVar23);
          poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_518 + 0x10),(char *)local_388._0_8_,local_388._8_8_
                              );
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"}\n",2);
          if ((ostream *)local_388._0_8_ != poVar17) {
            operator_delete((void *)local_388._0_8_,
                            CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                     (undefined2)local_378[0]._M_allocated_capacity) + 1);
          }
          auVar38 = ::std::_Rb_tree_increment(local_390);
        } while (auVar38._0_8_ != local_1e0);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_518 + 0x10),"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x1,n_02);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"}\n",2);
      if ((ostream *)local_388._0_8_ != poVar17) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_518);
      ::std::ios_base::~ios_base((ios_base *)local_1f8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1f0,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      uVar32 = local_1e8 + 1;
      pRVar35 = local_530;
    } while (uVar32 < (ulong)(((long)(local_530->animations).
                                     super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->animations).
                                     super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6) *
                             -0x5555555555555555));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"cameras {\n",10);
  if ((pRVar35->cameras).
      super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pRVar35->cameras).
      super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar36 = 0;
    uVar32 = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_558 = (pointer)::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_558,"] ",2);
      pRVar5 = (pRVar35->cameras).
               super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x1,n_03);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"camera {\n",9);
      pcVar1 = local_518 + 0x10;
      uVar23 = extraout_EDX_21;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_22;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"name ",5);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_518._0_8_ = pcVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_518,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_518,*(ulong *)((long)&(pRVar5->name)._M_dataplus._M_p + lVar36));
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_518,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_23;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_24;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_25;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_26;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"abs_path ",9);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_518._0_8_ = local_518 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_518,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_518,*(ulong *)((long)&(pRVar5->abs_path)._M_dataplus._M_p + lVar36));
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_518,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_27;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_28;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_29;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_30;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"display_name ",0xd);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_518._0_8_ = local_518 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_518,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append
                ((char *)local_518,
                 *(ulong *)((long)&(pRVar5->display_name)._M_dataplus._M_p + lVar36));
      puVar20 = (undefined8 *)
                ::std::__cxx11::string::_M_append
                          ((char *)local_518,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = puVar20 + 2;
      if ((long *)*puVar20 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = puVar20[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*puVar20;
      }
      local_590 = puVar20[1];
      *puVar20 = plVar16;
      puVar20[1] = 0;
      *(undefined1 *)(puVar20 + 2) = 0;
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_31;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_32;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_33;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_34;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"shutterOpen ",0xc);
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_5b8,vsnprintf,0x148,"%f",
                 (int)*(undefined8 *)((long)&pRVar5->shutterOpen + lVar36));
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pcVar1 = local_518 + 0x10;
      uVar23 = extraout_EDX_35;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_36;
      }
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_37;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"shutterClose ",0xd);
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_5b8,vsnprintf,0x148,"%f",
                 (int)*(undefined8 *)((long)&pRVar5->shutterClose + lVar36));
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_388 + 0x10),"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x1,n_04);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"}\n",2);
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_558,local_550,local_548)
      ;
      if (local_550 != (char *)&local_540) {
        operator_delete(local_550,CONCAT62(uStack_53e,local_540) + 1);
      }
      uVar32 = uVar32 + 1;
      lVar36 = lVar36 + 0x98;
      pRVar35 = local_530;
    } while (uVar32 < (ulong)(((long)(local_530->cameras).
                                     super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_530->cameras).
                                     super__Vector_base<tinyusdz::tydra::RenderCamera,_std::allocator<tinyusdz::tydra::RenderCamera>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x79435e50d79435e5));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"materials {\n",0xc);
  if ((pRVar35->materials).
      super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pRVar35->materials).
      super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar17 = (ostream *)(local_388 + 0x10);
    local_390 = local_308;
    local_520 = a_Stack_498;
    lVar36 = 0xcc;
    pUVar29 = (pointer)0x0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_558 = pUVar29;
      local_528 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,"] ",2);
      pRVar6 = (pRVar35->materials).
               super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_518);
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x1,n_05);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"material {\n",0xb);
      uVar23 = extraout_EDX_38;
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
        uVar23 = extraout_EDX_39;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"name ",5);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = local_388 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append((char *)local_388,*(ulong *)((long)pRVar6 + lVar36 + -0xcc))
      ;
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar23 = extraout_EDX_40;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_41;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_42;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_43;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"abs_path ",9);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = local_388 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append((char *)local_388,*(ulong *)((long)pRVar6 + lVar36 + -0xac))
      ;
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar23 = extraout_EDX_44;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_45;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_46;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_47;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),local_5b8._M_dataplus._M_p,
                           local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"display_name ",0xd);
      local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
      local_578.field_2._M_allocated_capacity._0_2_ = 0x22;
      local_578._M_string_length = 1;
      local_388._0_8_ = local_388 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_388,local_578._M_dataplus._M_p,
                 (undefined1 *)((long)&local_578.field_2 + 1));
      ::std::__cxx11::string::_M_append((char *)local_388,*(ulong *)((long)pRVar6 + lVar36 + -0x8c))
      ;
      plVar24 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)local_388,(ulong)local_578._M_dataplus._M_p);
      local_598 = &local_588;
      plVar16 = plVar24 + 2;
      if ((long *)*plVar24 == plVar16) {
        local_588 = *plVar16;
        lStack_580 = plVar24[3];
      }
      else {
        local_588 = *plVar16;
        local_598 = (long *)*plVar24;
      }
      local_590 = plVar24[1];
      *plVar24 = (long)plVar16;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar23 = extraout_EDX_48;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_49;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
        uVar23 = extraout_EDX_50;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_51;
      }
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"surfaceShader = ",0x10);
      if ((ostream *)local_388._0_8_ != (ostream *)(local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"PreviewSurfaceShader {\n",0x17);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_06);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"useSpecularWorkflow = ",0x16);
      bVar2 = *(byte *)((long)pRVar6 + lVar36 + -0x6c);
      local_598 = &local_588;
      ::std::__cxx11::string::_M_construct((ulong)&local_598,'\x01');
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_598,1,(uint)bVar2);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_598,local_590);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar23 = extraout_EDX_52;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
        uVar23 = extraout_EDX_53;
      }
      paVar33 = &local_5b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_54;
      }
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"diffuseColor = ",0xf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)pRVar6 + lVar36 + -0x5c) < 0) {
        ::std::operator<<(poVar17,(float3 *)((long)pRVar6 + lVar36 + -0x68));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<(poVar17,*(int *)((long)pRVar6 + lVar36 + -0x5c));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_07);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"metallic = ",0xb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)pRVar6 + lVar36 + -0x34) < 0) {
        ::std::ostream::_M_insert<double>((double)*(float *)((long)pRVar6 + lVar36 + -0x38));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<(poVar17,*(int *)((long)pRVar6 + lVar36 + -0x34));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_08);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"roughness = ",0xc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)pRVar6 + lVar36 + -0x2c) < 0) {
        ::std::ostream::_M_insert<double>((double)*(float *)((long)pRVar6 + lVar36 + -0x30));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<(poVar17,*(int *)((long)pRVar6 + lVar36 + -0x2c));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_09);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"ior = ",6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)&(pRVar6->surfaceShader).diffuseColor.value + lVar36 + 0xffffffffffffff98U)
          < 0) {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                     lVar36 + 0xffffffffffffff94U));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar17,*(int *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                             lVar36 + 0xffffffffffffff98U));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_10);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"clearcoat = ",0xc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)pRVar6 + lVar36 + -0x24) < 0) {
        ::std::ostream::_M_insert<double>((double)*(float *)((long)pRVar6 + lVar36 + -0x28));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<(poVar17,*(int *)((long)pRVar6 + lVar36 + -0x24));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_11);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"clearcoatRoughness = ",0x15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)(&(pRVar6->surfaceShader).diffuseColor + 0xfffffffffffffff8) + lVar36) < 0)
      {
        ::std::ostream::_M_insert<double>((double)*(float *)((long)pRVar6 + lVar36 + -0x20));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar17,*(int *)((long)(&(pRVar6->surfaceShader).diffuseColor +
                                                    0xfffffffffffffff8) + lVar36));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_12);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"opacity = ",10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)&(pRVar6->surfaceShader).diffuseColor.value + lVar36 + 0xffffffffffffff88U)
          < 0) {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                     lVar36 + 0xffffffffffffff84U));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar17,*(int *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                             lVar36 + 0xffffffffffffff88U));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_13);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"opacityThreshold = ",0x13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)(&(pRVar6->surfaceShader).diffuseColor + 0xfffffffffffffff9) + lVar36) < 0)
      {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                     lVar36 + 0xffffffffffffff8cU));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar17,*(int *)((long)(&(pRVar6->surfaceShader).diffuseColor +
                                                    0xfffffffffffffff9) + lVar36));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_14);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"normal = ",9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)&(pRVar6->surfaceShader).diffuseColor.value + lVar36 + 0xffffffffffffffa8U)
          < 0) {
        ::std::operator<<(poVar17,(float3 *)
                                  ((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                  lVar36 + 0xffffffffffffff9cU));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar17,*(int *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                             lVar36 + 0xffffffffffffffa8U));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_15);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"displacement = ",0xf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)(&(pRVar6->surfaceShader).diffuseColor + 0xfffffffffffffffb) + lVar36) < 0)
      {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                     lVar36 + 0xffffffffffffffacU));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar17,*(int *)((long)(&(pRVar6->surfaceShader).diffuseColor +
                                                    0xfffffffffffffffb) + lVar36));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x3,n_16);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"occlusion = ",0xc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if (*(int *)((long)&(pRVar6->surfaceShader).diffuseColor.value + lVar36 + 0xffffffffffffffb8U)
          < 0) {
        ::std::ostream::_M_insert<double>
                  ((double)*(float *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                     lVar36 + 0xffffffffffffffb4U));
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"texture_id[",0xb);
        poVar19 = (ostream *)
                  ::std::ostream::operator<<
                            (poVar17,*(int *)((long)&(pRVar6->surfaceShader).diffuseColor.value +
                                             lVar36 + 0xffffffffffffffb8U));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"]",1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_(&local_5b8,(pprint *)0x2,n_17);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"}\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_390);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_518 + 0x10),local_578._M_dataplus._M_p,local_578._M_string_length
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,
                        CONCAT62(local_578.field_2._M_allocated_capacity._2_6_,
                                 local_578.field_2._M_allocated_capacity._0_2_) + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_518 + 0x10),"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_388,(pprint *)0x1,n_18);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_518 + 0x10),(char *)local_388._0_8_,local_388._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"}\n",2);
      if ((ostream *)local_388._0_8_ != poVar17) {
        operator_delete((void *)local_388._0_8_,
                        CONCAT62(local_378[0]._M_allocated_capacity._2_6_,
                                 (undefined2)local_378[0]._M_allocated_capacity) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_518);
      ::std::ios_base::~ios_base((ios_base *)local_520);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,local_550,local_548);
      if (local_550 != (char *)&local_540) {
        operator_delete(local_550,CONCAT62(uStack_53e,local_540) + 1);
      }
      pUVar29 = (pointer)((long)&(local_558->prim_name)._M_dataplus._M_p + 1);
      lVar36 = lVar36 + 0x100;
      pRVar35 = local_530;
    } while (pUVar29 < (undefined1 *)
                       ((long)(local_530->materials).
                              super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_530->materials).
                              super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 8));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"textures {\n",0xb);
  if ((pRVar35->textures).
      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pRVar35->textures).
      super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar17 = (ostream *)0x0;
    do {
      poVar22 = (ostream *)(local_388 + 0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_520 = (_Rb_tree_node_base *)::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_520,"] ",2);
      pUVar29 = (pRVar35->textures).
                super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_528 = poVar17;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar22,"UVTexture {\n",0xc);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,n_19);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"primvar_name ",0xd);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,pUVar29[(long)poVar17].varname_uv._M_dataplus._M_p,
                           pUVar29[(long)poVar17].varname_uv._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      pcVar1 = local_518 + 0x10;
      uVar23 = extraout_EDX_55;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_56;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"connectedOutputChannel ",0x17);
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      local_558 = pUVar29 + (long)poVar17;
      local_518._0_8_ = pcVar1;
      switch(local_558->connectedOutputChannel) {
      case R:
        local_508[0]._0_2_ = 0x72;
        break;
      case G:
        local_508[0]._0_2_ = 0x67;
        break;
      case B:
        local_508[0]._0_2_ = 0x62;
        break;
      case A:
        local_508[0]._0_2_ = 0x61;
        break;
      case RGB:
        local_518._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x3;
        local_508[0]._0_4_ = 0x626772;
        goto LAB_00354b67;
      default:
        local_5b8._M_dataplus._M_p = (pointer)0x2d;
        local_518._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_518,(ulong)&local_5b8);
        local_518._8_8_ = local_5b8._M_dataplus._M_p;
        builtin_strncpy((char *)local_518._0_8_,"[[InternalError. Invalid UVTexture::Channel]]",0x2d
                       );
        *(char *)(local_518._0_8_ + (long)local_5b8._M_dataplus._M_p) = '\0';
        local_508[0]._0_8_ = local_518._8_8_;
        goto LAB_00354b67;
      }
      local_518._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x1;
LAB_00354b67:
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_57;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_58;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"authoredOutputChannels ",0x17);
      pcVar1 = local_518 + 0x10;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      psVar11 = &local_558->authoredOutputChannels;
      p_Var21 = *(_Base_ptr *)((long)&(local_558->authoredOutputChannels)._M_t._M_impl + 0x18);
      uVar26 = local_508[0]._M_allocated_capacity;
      while (local_508[0]._0_8_ = uVar26,
            (_Rb_tree_header *)p_Var21 != (_Rb_tree_header *)((long)&(psVar11->_M_t)._M_impl + 8U))
      {
        local_508[0]._M_allocated_capacity._2_6_ = (undefined6)((ulong)uVar26 >> 0x10);
        local_518._0_8_ = pcVar1;
        switch(p_Var21[1]._M_color) {
        case _S_red:
          local_508[0]._0_2_ = 0x72;
          break;
        case _S_black:
          local_508[0]._0_2_ = 0x67;
          break;
        case 2:
          local_508[0]._0_2_ = 0x62;
          break;
        case 3:
          local_508[0]._0_2_ = 0x61;
          break;
        case 4:
          local_518._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x3;
          local_508[0]._M_allocated_capacity._4_4_ = (undefined4)((ulong)uVar26 >> 0x20);
          local_508[0]._0_4_ = 0x626772;
          goto LAB_00354c9f;
        default:
          local_5b8._M_dataplus._M_p = (pointer)0x2d;
          local_518._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_518,(ulong)&local_5b8);
          local_518._8_8_ = local_5b8._M_dataplus._M_p;
          builtin_strncpy((char *)local_518._0_8_,"[[InternalError. Invalid UVTexture::Channel]]",
                          0x2d);
          *(char *)(local_518._0_8_ + (long)local_5b8._M_dataplus._M_p) = '\0';
          local_508[0]._0_8_ = local_518._8_8_;
          goto LAB_00354c9f;
        }
        local_518._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1;
LAB_00354c9f:
        poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar22,(char *)local_518._0_8_,local_518._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
        if ((char *)local_518._0_8_ != pcVar1) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        }
        p_Var21 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var21);
        uVar26 = local_508[0]._M_allocated_capacity;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,n_20);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"bias ",5);
      poVar17 = ::std::operator<<(poVar17,&local_558->bias);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pcVar1 = local_518 + 0x10;
      uVar23 = extraout_EDX_59;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_60;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"scale ",6);
      poVar17 = ::std::operator<<(poVar17,&local_558->scale);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_61;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_62;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"wrapS ",6);
      to_string_abi_cxx11_(&local_5b8,(tydra *)(ulong)local_558->wrapS,mode);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_63;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_64;
      }
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_65;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"wrapT ",6);
      to_string_abi_cxx11_(&local_5b8,(tydra *)(ulong)local_558->wrapT,mode_00);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_66;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_67;
      }
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_68;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"fallback_uv ",0xc);
      pUVar29 = local_558;
      poVar17 = ::std::operator<<(poVar17,&local_558->fallback_uv);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_69;
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_70;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"textureImageID ",0xf);
      uVar32 = pUVar29->texture_image_id;
      uVar30 = -uVar32;
      if (0 < (long)uVar32) {
        uVar30 = uVar32;
      }
      uVar34 = 1;
      if (9 < uVar30) {
        uVar25 = uVar30;
        uVar10 = 4;
        do {
          uVar34 = uVar10;
          if (uVar25 < 100) {
            uVar34 = uVar34 - 2;
            goto LAB_00355169;
          }
          if (uVar25 < 1000) {
            uVar34 = uVar34 - 1;
            goto LAB_00355169;
          }
          if (uVar25 < 10000) goto LAB_00355169;
          bVar9 = 99999 < uVar25;
          uVar25 = uVar25 / 10000;
          uVar10 = uVar34 + 4;
        } while (bVar9);
        uVar34 = uVar34 + 1;
      }
LAB_00355169:
      paVar33 = &local_5b8.field_2;
      local_5b8._M_dataplus._M_p = (pointer)paVar33;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar34 - (char)((long)uVar32 >> 0x3f));
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_5b8._M_dataplus._M_p + -((long)uVar32 >> 0x3f),uVar34,uVar30);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_71;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_72;
      }
      pcVar1 = local_518 + 0x10;
      poVar17 = (ostream *)(local_388 + 0x10);
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_73;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"has UsdTransform2d ",0x13);
      bVar9 = local_558->has_transform2d;
      local_5b8._M_dataplus._M_p = (pointer)paVar33;
      ::std::__cxx11::string::_M_construct((ulong)&local_5b8,'\x01');
      ::std::__detail::__to_chars_10_impl<unsigned_int>(local_5b8._M_dataplus._M_p,1,(uint)bVar9);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar23 = extraout_EDX_74;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != paVar33) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_75;
      }
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_76;
      }
      pUVar29 = local_558;
      if (local_558->has_transform2d != false) {
        pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x3,uVar23);
        poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,(char *)local_518._0_8_,local_518._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"rotation ",9);
        poVar19 = ::std::ostream::_M_insert<double>((double)pUVar29->tx_rotation);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
        uVar23 = extraout_EDX_77;
        if ((char *)local_518._0_8_ != pcVar1) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
          uVar23 = extraout_EDX_78;
        }
        pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x3,uVar23);
        poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,(char *)local_518._0_8_,local_518._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"scale ",6);
        poVar19 = ::std::operator<<(poVar19,&local_558->tx_scale);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
        uVar23 = extraout_EDX_79;
        if ((char *)local_518._0_8_ != pcVar1) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
          uVar23 = extraout_EDX_80;
        }
        pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x3,uVar23);
        poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,(char *)local_518._0_8_,local_518._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"translation ",0xc);
        poVar19 = ::std::operator<<(poVar19,&local_558->tx_translation);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
        uVar23 = extraout_EDX_81;
        if ((char *)local_518._0_8_ != pcVar1) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
          uVar23 = extraout_EDX_82;
        }
        pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x3,uVar23);
        poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                            (poVar17,(char *)local_518._0_8_,local_518._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"computed_transform ",0x13);
        poVar19 = ::std::operator<<(poVar19,&local_558->transform);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
        if ((char *)local_518._0_8_ != pcVar1) {
          operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x1,n_21);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"}\n",2);
      if ((char *)local_518._0_8_ != pcVar1) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_520,(char *)local_598,local_590);
      pRVar35 = local_530;
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
      }
      poVar17 = local_528 + 1;
    } while (poVar17 < (ostream *)
                       (((long)(pRVar35->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pRVar35->textures).
                               super__Vector_base<tinyusdz::tydra::UVTexture,_std::allocator<tinyusdz::tydra::UVTexture>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7d05f417d05f417d
                       ));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"images {\n",9);
  if ((pRVar35->images).
      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pRVar35->images).
      super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pUVar29 = (pointer)0x0;
    do {
      poVar19 = (ostream *)(local_388 + 0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      local_528 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,"] ",2);
      pTVar7 = (pRVar35->images).
               super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_558 = pUVar29;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"TextureImage {\n",0xf);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,n_22);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"asset_identifier \"",0x12);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,pTVar7[(long)pUVar29].asset_identifier._M_dataplus._M_p,
                           pTVar7[(long)pUVar29].asset_identifier._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\"\n",2);
      uVar23 = extraout_EDX_83;
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_84;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"channels ",9);
      uVar34 = pTVar7[(long)pUVar29].channels;
      uVar10 = -uVar34;
      if (0 < (int)uVar34) {
        uVar10 = uVar34;
      }
      uVar28 = 1;
      if (9 < uVar10) {
        uVar32 = (ulong)uVar10;
        uVar13 = 4;
        do {
          uVar28 = uVar13;
          uVar15 = (uint)uVar32;
          if (uVar15 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_00355800;
          }
          if (uVar15 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_00355800;
          }
          if (uVar15 < 10000) goto LAB_00355800;
          uVar32 = uVar32 / 10000;
          uVar13 = uVar28 + 4;
        } while (99999 < uVar15);
        uVar28 = uVar28 + 1;
      }
LAB_00355800:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar28 - (char)((int)uVar34 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_5b8._M_dataplus._M_p + (uVar34 >> 0x1f),uVar28,uVar10);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_85;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_86;
      }
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_87;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"width ",6);
      uVar34 = pTVar7[(long)pUVar29].width;
      uVar10 = -uVar34;
      if (0 < (int)uVar34) {
        uVar10 = uVar34;
      }
      uVar28 = 1;
      if (9 < uVar10) {
        uVar32 = (ulong)uVar10;
        uVar13 = 4;
        do {
          uVar28 = uVar13;
          uVar15 = (uint)uVar32;
          if (uVar15 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_00355932;
          }
          if (uVar15 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_00355932;
          }
          if (uVar15 < 10000) goto LAB_00355932;
          uVar32 = uVar32 / 10000;
          uVar13 = uVar28 + 4;
        } while (99999 < uVar15);
        uVar28 = uVar28 + 1;
      }
LAB_00355932:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar28 - (char)((int)uVar34 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_5b8._M_dataplus._M_p + (uVar34 >> 0x1f),uVar28,uVar10);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_89;
      }
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_90;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"height ",7);
      uVar34 = pTVar7[(long)pUVar29].height;
      uVar10 = -uVar34;
      if (0 < (int)uVar34) {
        uVar10 = uVar34;
      }
      uVar28 = 1;
      if (9 < uVar10) {
        uVar32 = (ulong)uVar10;
        uVar13 = 4;
        do {
          uVar28 = uVar13;
          uVar15 = (uint)uVar32;
          if (uVar15 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_00355a64;
          }
          if (uVar15 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_00355a64;
          }
          if (uVar15 < 10000) goto LAB_00355a64;
          uVar32 = uVar32 / 10000;
          uVar13 = uVar28 + 4;
        } while (99999 < uVar15);
        uVar28 = uVar28 + 1;
      }
LAB_00355a64:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar28 - (char)((int)uVar34 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_5b8._M_dataplus._M_p + (uVar34 >> 0x1f),uVar28,uVar10);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_91;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_92;
      }
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_93;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_388 + 0x10),(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"miplevel ",9);
      uVar34 = pTVar7[(long)pUVar29].miplevel;
      uVar10 = -uVar34;
      if (0 < (int)uVar34) {
        uVar10 = uVar34;
      }
      uVar28 = 1;
      if (9 < uVar10) {
        uVar32 = (ulong)uVar10;
        uVar13 = 4;
        do {
          uVar28 = uVar13;
          uVar15 = (uint)uVar32;
          if (uVar15 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_00355b96;
          }
          if (uVar15 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_00355b96;
          }
          if (uVar15 < 10000) goto LAB_00355b96;
          uVar32 = uVar32 / 10000;
          uVar13 = uVar28 + 4;
        } while (99999 < uVar15);
        uVar28 = uVar28 + 1;
      }
LAB_00355b96:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar28 - (char)((int)uVar34 >> 0x1f));
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_5b8._M_dataplus._M_p + (uVar34 >> 0x1f),uVar28,uVar10);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      uVar23 = extraout_EDX_94;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_95;
      }
      poVar17 = (ostream *)(local_388 + 0x10);
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_96;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"colorSpace ",0xb);
      to_string_abi_cxx11_(&local_5b8,(tydra *)(ulong)pTVar7[(long)pUVar29].colorSpace,cty);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      uVar23 = extraout_EDX_97;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
        uVar23 = extraout_EDX_98;
      }
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_99;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"bufferID ",9);
      uVar32 = pTVar7[(long)pUVar29].buffer_id;
      uVar30 = -uVar32;
      if (0 < (long)uVar32) {
        uVar30 = uVar32;
      }
      uVar34 = 1;
      if (9 < uVar30) {
        uVar25 = uVar30;
        uVar10 = 4;
        do {
          uVar34 = uVar10;
          if (uVar25 < 100) {
            uVar34 = uVar34 - 2;
            goto LAB_00355d8d;
          }
          if (uVar25 < 1000) {
            uVar34 = uVar34 - 1;
            goto LAB_00355d8d;
          }
          if (uVar25 < 10000) goto LAB_00355d8d;
          bVar9 = 99999 < uVar25;
          uVar25 = uVar25 / 10000;
          uVar10 = uVar34 + 4;
        } while (bVar9);
        uVar34 = uVar34 + 1;
      }
LAB_00355d8d:
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_5b8,(char)uVar34 - (char)((long)uVar32 >> 0x3f));
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_5b8._M_dataplus._M_p + -((long)uVar32 >> 0x3f),uVar34,uVar30);
      poVar19 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar19,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      pRVar35 = local_530;
      pUVar29 = local_558;
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x1,n_23);
      poVar17 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"}\n",2);
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_528,(char *)local_598,local_590);
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
      }
      pUVar29 = (pointer)((long)&(pUVar29->prim_name)._M_dataplus._M_p + 1);
    } while (pUVar29 < (undefined1 *)
                       (((long)(pRVar35->images).
                               super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pRVar35->images).
                               super__Vector_base<tinyusdz::tydra::TextureImage,_std::allocator<tinyusdz::tydra::TextureImage>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333
                       ));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"buffers {\n",10);
  if ((pRVar35->buffers).
      super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pRVar35->buffers).
      super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    poVar17 = (ostream *)(local_388 + 0x10);
    lVar36 = 0x10;
    uVar32 = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[",1);
      poVar19 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,"] ",2);
      pBVar8 = (pRVar35->buffers).
               super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_388);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"Buffer {\n",9);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,n_24);
      poVar22 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar22,"bytes ",6);
      poVar22 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\n",1);
      uVar23 = extraout_EDX_x00100;
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
        uVar23 = extraout_EDX_x00101;
      }
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x2,uVar23);
      poVar22 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar22,"componentType ",0xe);
      to_string_abi_cxx11_
                (&local_5b8,(tydra *)(ulong)*(uint *)((long)pBVar8 + lVar36 + -0x10),cty_00);
      poVar22 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,local_5b8._M_dataplus._M_p,local_5b8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      pprint::Indent_abi_cxx11_((string *)local_518,(pprint *)0x1,n_25);
      poVar22 = ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar17,(char *)local_518._0_8_,local_518._8_8_);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar22,"}\n",2);
      if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
        operator_delete((void *)local_518._0_8_,(ulong)(local_508[0]._M_allocated_capacity + 1));
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_388);
      ::std::ios_base::~ios_base((ios_base *)local_308);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar19,(char *)local_598,local_590);
      if (local_598 != &local_588) {
        operator_delete(local_598,local_588 + 1);
      }
      uVar32 = uVar32 + 1;
      lVar36 = lVar36 + 0x20;
      pRVar35 = local_530;
    } while (uVar32 < (ulong)((long)(local_530->buffers).
                                    super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_530->buffers).
                                    super__Vector_base<tinyusdz::tydra::BufferData,_std::allocator<tinyusdz::tydra::BufferData>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"}\n",2);
  psVar12 = local_200;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar12;
}

Assistant:

std::string DumpRenderScene(const RenderScene &scene,
                            const std::string &format) {
  std::stringstream ss;

  if (format == "json") {
    // TODO:
    // Currently kdl only.
    ss << "// `json` format is not supported yet. Use KDL format\n";
  }

  ss << "title " << quote(scene.usd_filename) << "\n";
  ss << "default_root_node " << scene.default_root_node << "\n";
  ss << "// # of Root Nodes : " << scene.nodes.size() << "\n";
  ss << "// # of Meshes : " << scene.meshes.size() << "\n";
  ss << "// # of Skeletons : " << scene.skeletons.size() << "\n";
  ss << "// # of Animations : " << scene.animations.size() << "\n";
  ss << "// # of Cameras : " << scene.cameras.size() << "\n";
  ss << "// # of Materials : " << scene.materials.size() << "\n";
  ss << "// # of UVTextures : " << scene.textures.size() << "\n";
  ss << "// # of TextureImages : " << scene.images.size() << "\n";
  ss << "// # of Buffers : " << scene.buffers.size() << "\n";

  ss << "\n";

  ss << "nodes {\n";
  for (size_t i = 0; i < scene.nodes.size(); i++) {
    ss << DumpNode(scene.nodes[i], 1);
  }
  ss << "}\n";

  ss << "meshes {\n";
  for (size_t i = 0; i < scene.meshes.size(); i++) {
    ss << "[" << i << "] " << DumpMesh(scene.meshes[i], 1);
  }
  ss << "}\n";

  ss << "skeletons {\n";
  for (size_t i = 0; i < scene.skeletons.size(); i++) {
    ss << "[" << i << "] " << DumpSkeleton(scene.skeletons[i], 1);
  }
  ss << "}\n";

  ss << "animations {\n";
  for (size_t i = 0; i < scene.animations.size(); i++) {
    ss << "[" << i << "] " << DumpAnimation(scene.animations[i], 1);
  }
  ss << "}\n";

  ss << "cameras {\n";
  for (size_t i = 0; i < scene.cameras.size(); i++) {
    ss << "[" << i << "] " << DumpCamera(scene.cameras[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "materials {\n";
  for (size_t i = 0; i < scene.materials.size(); i++) {
    ss << "[" << i << "] " << DumpMaterial(scene.materials[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "textures {\n";
  for (size_t i = 0; i < scene.textures.size(); i++) {
    ss << "[" << i << "] " << DumpUVTexture(scene.textures[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "images {\n";
  for (size_t i = 0; i < scene.images.size(); i++) {
    ss << "[" << i << "] " << DumpImage(scene.images[i], 1);
  }
  ss << "}\n";

  ss << "\n";
  ss << "buffers {\n";
  for (size_t i = 0; i < scene.buffers.size(); i++) {
    ss << "[" << i << "] " << DumpBuffer(scene.buffers[i], 1);
  }
  ss << "}\n";

  // ss << "TODO: AnimationChannel, ...\n";

  return ss.str();
}